

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O0

int nn_bus_send(nn_sockbase *self,nn_msg *msg)

{
  FILE *__stream;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  nn_sockbase *in_RSI;
  nn_chunkref *in_RDI;
  nn_bus *bus;
  int rc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  if (in_RDI == (nn_chunkref *)0x0) {
    in_RDI = (nn_chunkref *)0x0;
  }
  sVar2 = nn_chunkref_size(in_RDI);
  if (sVar2 == 0) {
    iVar1 = nn_xbus_send(in_RSI,(nn_msg *)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (iVar1 != 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar3 = nn_err_strerror((int)((ulong)_stderr >> 0x20));
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/bus/bus.c"
              ,0x5e);
      fflush(_stderr);
      nn_err_abort();
    }
    local_4 = 0;
  }
  else {
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

static int nn_bus_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_bus *bus;

    bus = nn_cont (self, struct nn_bus, xbus.sockbase);

    /*  Check for malformed messages. */
    if (nn_chunkref_size (&msg->sphdr))
        return -EINVAL;

    /*  Send the message. */
    rc = nn_xbus_send (&bus->xbus.sockbase, msg);
    errnum_assert (rc == 0, -rc);

    return 0;
}